

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::
make_uniq_base<duckdb::AlterInfo,duckdb::ChangeColumnTypeInfo,duckdb::AlterEntryData,std::__cxx11::string_const&,duckdb::LogicalType_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
          (duckdb *this,AlterEntryData *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          LogicalType *args_2,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *args_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> _Var4;
  ChangeColumnTypeInfo *this_00;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_e0;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> local_d8;
  AlterEntryData local_d0;
  LogicalType local_68;
  string local_50;
  
  local_d8._M_head_impl = (AlterInfo *)this;
  this_00 = (ChangeColumnTypeInfo *)operator_new(0xb8);
  local_d0.catalog._M_dataplus._M_p = (pointer)&local_d0.catalog.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(args->catalog)._M_dataplus._M_p;
  paVar1 = &(args->catalog).field_2;
  if (paVar2 == paVar1) {
    local_d0.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d0.catalog.field_2._8_4_ = *(undefined4 *)((long)&(args->catalog).field_2 + 8);
    local_d0.catalog.field_2._12_4_ = *(undefined4 *)((long)&(args->catalog).field_2 + 0xc);
  }
  else {
    local_d0.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d0.catalog._M_dataplus._M_p = (pointer)paVar2;
  }
  local_d0.catalog._M_string_length = (args->catalog)._M_string_length;
  local_d0.schema._M_dataplus._M_p = (pointer)&local_d0.schema.field_2;
  (args->catalog)._M_dataplus._M_p = (pointer)paVar1;
  (args->catalog)._M_string_length = 0;
  (args->catalog).field_2._M_local_buf[0] = '\0';
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(args->schema)._M_dataplus._M_p;
  paVar1 = &(args->schema).field_2;
  if (paVar2 == paVar1) {
    local_d0.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d0.schema.field_2._8_4_ = *(undefined4 *)((long)&(args->schema).field_2 + 8);
    local_d0.schema.field_2._12_4_ = *(undefined4 *)((long)&(args->schema).field_2 + 0xc);
  }
  else {
    local_d0.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d0.schema._M_dataplus._M_p = (pointer)paVar2;
  }
  local_d0.schema._M_string_length = (args->schema)._M_string_length;
  paVar2 = &local_d0.name.field_2;
  (args->schema)._M_dataplus._M_p = (pointer)paVar1;
  (args->schema)._M_string_length = 0;
  (args->schema).field_2._M_local_buf[0] = '\0';
  local_d0.name._M_dataplus._M_p = (args->name)._M_dataplus._M_p;
  paVar1 = &(args->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name._M_dataplus._M_p == paVar1) {
    local_d0.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d0.name.field_2._8_4_ = *(undefined4 *)((long)&(args->name).field_2 + 8);
    local_d0.name.field_2._12_4_ = *(undefined4 *)((long)&(args->name).field_2 + 0xc);
    local_d0.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d0.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_d0.name._M_string_length = (args->name)._M_string_length;
  (args->name)._M_dataplus._M_p = (pointer)paVar1;
  (args->name)._M_string_length = 0;
  (args->name).field_2._M_local_buf[0] = '\0';
  local_d0.if_not_found = args->if_not_found;
  pcVar3 = (args_1->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + args_1->_M_string_length);
  LogicalType::LogicalType(&local_68,args_2);
  local_e0._M_head_impl =
       (args_3->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (args_3->
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  ChangeColumnTypeInfo::ChangeColumnTypeInfo
            (this_00,&local_d0,&local_50,&local_68,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_e0);
  _Var4._M_head_impl = local_d8._M_head_impl;
  ((local_d8._M_head_impl)->super_ParseInfo)._vptr_ParseInfo = (_func_int **)this_00;
  if (local_e0._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_e0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_e0._M_head_impl = (ParsedExpression *)0x0;
  LogicalType::~LogicalType(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.schema._M_dataplus._M_p != &local_d0.schema.field_2) {
    operator_delete(local_d0.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.catalog._M_dataplus._M_p != &local_d0.catalog.field_2) {
    operator_delete(local_d0.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)_Var4._M_head_impl;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}